

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall ot::commissioner::coap::Coap::Retransmit(Coap *this,Timer *param_1)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  char *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  bool local_7d1;
  anon_class_1_0_00000001 local_792;
  v10 local_791;
  v10 *local_790;
  char *local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  Error local_760;
  Coap *local_738;
  anon_class_1_0_00000001 local_72a;
  v10 local_729;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_728;
  char *local_720;
  string local_718;
  allocator local_6f1;
  string local_6f0;
  Error local_6d0;
  string local_6a8;
  Coap *local_688;
  anon_class_1_0_00000001 local_67a;
  v10 local_679;
  v10 *local_678;
  char *local_670;
  string local_668;
  allocator local_641;
  string local_640;
  ErrorCode local_61c;
  undefined1 local_618 [8];
  Error error;
  anon_class_1_0_00000001 local_5e2;
  v10 local_5e1;
  v10 *local_5e0;
  char *local_5d8;
  string local_5d0;
  allocator local_5a9;
  string local_5a8;
  Error local_588;
  undefined1 local_560 [8];
  string uri_1;
  rep local_538;
  Error local_530;
  allocator local_501;
  undefined1 local_500 [8];
  string uri;
  RequestHolder requestHolder;
  undefined1 local_488 [15];
  v10 local_479;
  v10 *local_478;
  char *local_470;
  string local_468;
  allocator local_431;
  string local_430;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_410;
  time_point now;
  Timer *param_1_local;
  Coap *this_local;
  undefined1 local_3e8 [16];
  v10 *local_3d8;
  char *local_3d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3c8;
  v10 *local_3c0;
  char *pcStack_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_380 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  char *local_368;
  void **local_360;
  v10 *local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  char *pcStack_348;
  string *local_340;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> *local_338 [2];
  undefined1 local_328 [16];
  v10 *local_318;
  char *local_310;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> *local_308;
  v10 *local_300;
  char *pcStack_2f8;
  string *local_2f0;
  v10 *local_2e8;
  v10 **local_2e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2d8;
  undefined1 local_2a8 [16];
  v10 *local_298;
  char *local_290;
  _Invoker_type *local_288;
  void **local_280;
  v10 *local_278;
  v10 *local_270;
  char *pcStack_268;
  string *local_260;
  v10 *local_258;
  v10 **local_250;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined1 local_210 [16];
  v10 *local_200;
  char *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  void **local_1e8;
  v10 *local_1e0;
  v10 *local_1d8;
  char *pcStack_1d0;
  string *local_1c8;
  v10 *local_1c0;
  v10 **local_1b8;
  v10 *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1a8;
  v10 *local_1a0;
  v10 **local_198;
  v10 **local_190;
  v10 *local_188;
  char *pcStack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  undefined1 *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  undefined8 local_150;
  undefined1 *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  char *pcStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  undefined1 *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined8 local_108;
  undefined1 *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  v10 **local_f0;
  v10 *local_e8;
  char *pcStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined8 local_68;
  undefined1 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  undefined1 *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  now.__d.__r = (duration)(duration)param_1;
  local_410.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::allocator<char>::allocator();
  this_01 = "coap";
  std::__cxx11::string::string((string *)&local_430,"coap",&local_431);
  Retransmit::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)(local_488 + 0xe));
  local_2e0 = &local_478;
  local_2e8 = &local_479;
  bVar3 = ::fmt::v10::operator()(local_2e8);
  local_470 = (char *)bVar3.size_;
  local_478 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<void_*,_FMT_COMPILE_STRING,_0>();
  local_2f0 = &local_468;
  local_300 = local_478;
  pcStack_2f8 = local_470;
  local_308 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> *)
              local_488;
  local_f0 = &local_300;
  local_318 = local_478;
  local_310 = local_470;
  local_488._0_8_ = this;
  local_e8 = local_318;
  pcStack_e0 = local_310;
  local_338[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*>
                           (local_308,(v10 *)this_01,(void **)local_2f0);
  local_c8 = local_328;
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338;
  local_b0 = 0xe;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)args_2;
  fmt.size_ = 0xe;
  fmt.data_ = local_310;
  local_d0 = args_2;
  local_c0 = args_2;
  local_b8 = args_2;
  local_a8 = local_c8;
  ::fmt::v10::vformat_abi_cxx11_(&local_468,local_318,fmt,args);
  Log(kDebug,&local_430,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  while( true ) {
    bVar1 = RequestsCache::IsEmpty(&this->mRequestsCache);
    local_7d1 = false;
    if (!bVar1) {
      requestHolder._72_8_ = RequestsCache::Earliest(&this->mRequestsCache);
      local_7d1 = std::chrono::operator<
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&requestHolder.mAcknowledged,&local_410);
    }
    if (local_7d1 == false) break;
    RequestsCache::Eliminate((RequestHolder *)((long)&uri.field_2 + 8),&this->mRequestsCache);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_500,"UNKOWN_URI",&local_501);
    std::allocator<char>::~allocator((allocator<char> *)&local_501);
    peVar2 = std::
             __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(uri.field_2._M_local_buf + 8));
    Message::GetUriPath(&local_530,peVar2,(string *)local_500);
    Error::IgnoreError(&local_530);
    Error::~Error(&local_530);
    this_00 = std::
              __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)(uri.field_2._M_local_buf + 8));
    bVar1 = Message::IsConfirmable(this_00);
    if ((bVar1) && ((uint)requestHolder.mHandler._M_invoker < 4)) {
      requestHolder.mHandler._M_invoker._0_4_ = (uint)requestHolder.mHandler._M_invoker + 1;
      local_538 = 2;
      std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator*=
                ((duration<long,_std::ratio<1L,_1000L>_> *)&requestHolder.mRetransmissionCount,
                 &local_538);
      uri_1.field_2._8_8_ =
           std::chrono::operator+
                     (&local_410,
                      (duration<long,_std::ratio<1L,_1000L>_> *)&requestHolder.mRetransmissionCount)
      ;
      requestHolder.mRetransmissionDelay.__r = uri_1.field_2._8_8_;
      RequestsCache::Put(&this->mRequestsCache,(RequestHolder *)((long)&uri.field_2 + 8));
      std::__cxx11::string::string((string *)local_560);
      peVar2 = std::
               __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(uri.field_2._M_local_buf + 8));
      Message::GetUriPath(&local_588,peVar2,(string *)local_560);
      IgnoreError(&local_588);
      Error::~Error(&local_588);
      if (((byte)requestHolder.mNextTimerShot.__d.__r & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_5a8,"coap",&local_5a9);
        Retransmit::anon_class_1_0_00000001::operator()(&local_5e2);
        local_250 = &local_5e0;
        local_258 = &local_5e1;
        bVar3 = ::fmt::v10::operator()(local_258);
        local_5d8 = (char *)bVar3.size_;
        local_5e0 = (v10 *)bVar3.data_;
        ::fmt::v10::detail::
        check_format_string<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_288 = &requestHolder.mHandler._M_invoker;
        local_260 = &local_5d0;
        local_270 = local_5e0;
        pcStack_268 = local_5d8;
        local_278 = (v10 *)(error.mMessage.field_2._M_local_buf + 8);
        local_280 = (void **)local_560;
        local_a0 = &local_270;
        local_298 = local_5e0;
        local_290 = local_5d8;
        error.mMessage.field_2._8_8_ = this;
        local_98 = local_298;
        pcStack_90 = local_290;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string,unsigned_int>
                  (&local_2d8,local_278,local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   (uint *)args_2);
        local_78 = local_2a8;
        args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d8;
        local_68 = 0x2de;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)args_2;
        fmt_00.size_ = 0x2de;
        fmt_00.data_ = local_290;
        local_80 = args_2;
        local_70 = args_2;
        local_60 = local_78;
        local_58 = args_2;
        ::fmt::v10::vformat_abi_cxx11_(&local_5d0,local_298,fmt_00,args_00);
        Log(kInfo,&local_5a8,&local_5d0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
        peVar2 = std::
                 __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)(uri.field_2._M_local_buf + 8));
        Send((Error *)local_618,this,peVar2);
        local_61c = kNone;
        bVar1 = commissioner::operator!=((Error *)local_618,&local_61c);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_640,"coap",&local_641);
          Retransmit::anon_class_1_0_00000001::operator()(&local_67a);
          local_1b8 = &local_678;
          local_1c0 = &local_679;
          bVar3 = ::fmt::v10::operator()(local_1c0);
          local_670 = (char *)bVar3.size_;
          local_678 = (v10 *)bVar3.data_;
          ::fmt::v10::detail::
          check_format_string<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                    ();
          local_688 = this;
          Error::ToString_abi_cxx11_(&local_6a8,(Error *)local_618);
          local_1c8 = &local_668;
          local_1d8 = local_678;
          pcStack_1d0 = local_670;
          local_1e0 = (v10 *)&local_688;
          local_1e8 = (void **)local_560;
          local_1f0 = &local_6a8;
          local_50 = &local_1d8;
          local_200 = local_678;
          local_1f8 = local_670;
          local_48 = local_200;
          pcStack_40 = local_1f8;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string,std::__cxx11::string>
                    (&local_248,local_1e0,local_1e8,local_1f0,args_2);
          local_30 = local_210;
          args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248;
          local_20 = 0xdde;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)args_2;
          fmt_01.size_ = 0xdde;
          fmt_01.data_ = local_1f8;
          local_38 = args_2;
          local_28 = args_2;
          local_18 = local_30;
          local_10 = args_2;
          ::fmt::v10::vformat_abi_cxx11_(&local_668,local_200,fmt_01,args_01);
          Log(kWarn,&local_640,&local_668);
          std::__cxx11::string::~string((string *)&local_668);
          std::__cxx11::string::~string((string *)&local_6a8);
          std::__cxx11::string::~string((string *)&local_640);
          std::allocator<char>::~allocator((allocator<char> *)&local_641);
          Error::Error(&local_6d0,(Error *)local_618);
          FinalizeTransaction(this,(RequestHolder *)((long)&uri.field_2 + 8),(Response *)0x0,
                              &local_6d0);
          Error::~Error(&local_6d0);
        }
        Error::~Error((Error *)local_618);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_6f0,"coap",&local_6f1);
        Retransmit::anon_class_1_0_00000001::operator()(&local_72a);
        local_1a8 = &local_728;
        local_1b0 = &local_729;
        bVar3 = ::fmt::v10::operator()(local_1b0);
        local_720 = (char *)bVar3.size_;
        local_728 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.data_
        ;
        ::fmt::v10::detail::
        check_format_string<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_340 = &local_718;
        local_350 = local_728;
        pcStack_348 = local_720;
        local_358 = (v10 *)&local_738;
        local_360 = (void **)local_560;
        local_140 = &local_350;
        local_370 = local_728;
        local_368 = local_720;
        local_738 = this;
        local_138 = local_370;
        pcStack_130 = local_368;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string>
                  ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3a8,local_358,local_360,local_728);
        local_118 = local_380;
        args_2 = &local_3a8;
        local_108 = 0xde;
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)args_2;
        fmt_02.size_ = 0xde;
        fmt_02.data_ = local_368;
        local_120 = args_2;
        local_110 = args_2;
        local_100 = local_118;
        local_f8 = args_2;
        ::fmt::v10::vformat_abi_cxx11_(&local_718,(v10 *)local_370,fmt_02,args_02);
        Log(kDebug,&local_6f0,&local_718);
        std::__cxx11::string::~string((string *)&local_718);
        std::__cxx11::string::~string((string *)&local_6f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
      }
      std::__cxx11::string::~string((string *)local_560);
    }
    else {
      Retransmit::anon_class_1_0_00000001::operator()(&local_792);
      local_198 = &local_790;
      local_1a0 = &local_791;
      bVar3 = ::fmt::v10::operator()(local_1a0);
      local_788 = (char *)bVar3.size_;
      local_790 = (v10 *)bVar3.data_;
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_3b0 = &local_780;
      local_3c0 = local_790;
      pcStack_3b8 = local_788;
      local_3c8 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_500;
      local_190 = &local_3c0;
      local_3d8 = local_790;
      local_3d0 = local_788;
      local_188 = local_3d8;
      pcStack_180 = local_3d0;
      this_local = (Coap *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                     (local_3c8,(v10 *)peVar2,local_3b0);
      local_168 = local_3e8;
      args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this_local;
      local_150 = 0xd;
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)args_2;
      fmt_03.size_ = 0xd;
      fmt_03.data_ = local_3d0;
      local_170 = args_2;
      local_160 = args_2;
      local_158 = args_2;
      local_148 = local_168;
      ::fmt::v10::vformat_abi_cxx11_(&local_780,local_3d8,fmt_03,args_03);
      Error::Error(&local_760,kTimeout,&local_780);
      FinalizeTransaction(this,(RequestHolder *)((long)&uri.field_2 + 8),(Response *)0x0,&local_760)
      ;
      Error::~Error(&local_760);
      std::__cxx11::string::~string((string *)&local_780);
    }
    std::__cxx11::string::~string((string *)local_500);
    RequestHolder::~RequestHolder((RequestHolder *)((long)&uri.field_2 + 8));
  }
  RequestsCache::UpdateTimer(&this->mRequestsCache);
  return;
}

Assistant:

void Coap::Retransmit(Timer &)
{
    auto now = Clock::now();

    LOG_DEBUG(LOG_REGION_COAP, "client(={}) retransmit timer triggered", static_cast<void *>(this));

    while (!mRequestsCache.IsEmpty() && mRequestsCache.Earliest() < now)
    {
        auto requestHolder = mRequestsCache.Eliminate();

        std::string uri = "UNKOWN_URI";
        requestHolder.mRequest->GetUriPath(uri).IgnoreError();

        if ((requestHolder.mRequest->IsConfirmable()) && (requestHolder.mRetransmissionCount < kMaxRetransmit))
        {
            // Increment retransmission counter and timer.
            ++requestHolder.mRetransmissionCount;
            requestHolder.mRetransmissionDelay *= 2;
            requestHolder.mNextTimerShot = now + requestHolder.mRetransmissionDelay;

            mRequestsCache.Put(requestHolder);

            std::string uri;
            IgnoreError(requestHolder.mRequest->GetUriPath(uri));

            // Retransmit
            if (!requestHolder.mAcknowledged)
            {
                LOG_INFO(LOG_REGION_COAP, "client(={}) retransmit request {}, retransmit count = {}",
                         static_cast<void *>(this), uri, requestHolder.mRetransmissionCount);

                auto error = Send(*requestHolder.mRequest);
                if (error != ErrorCode::kNone)
                {
                    LOG_WARN(LOG_REGION_COAP, "client(={}) retransmit request {} failed: {}", static_cast<void *>(this),
                             uri, error.ToString());
                    FinalizeTransaction(requestHolder, nullptr, error);
                }
            }
            else
            {
                LOG_DEBUG(LOG_REGION_COAP, "client(={}) request to {} has been acknowledged, won't retransmit",
                          static_cast<void *>(this), uri);
            }
        }
        else
        {
            // No expected response or acknowledgment.
            FinalizeTransaction(requestHolder, nullptr, ERROR_TIMEOUT("request to {} timeout", uri));
        }
    }

    mRequestsCache.UpdateTimer();
}